

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_fprintdot_nc_rec(FILE *out,MTBDD mtbdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  size_t __size;
  char *__ptr;
  long lVar3;
  
  puVar1 = nodes->data;
  lVar3 = (mtbdd & 0xffffffffff) * 0x10;
  uVar2 = *(ulong *)(puVar1 + lVar3);
  if ((uVar2 >> 0x3d & 1) != 0) {
    return;
  }
  *(ulong *)(puVar1 + lVar3) = uVar2 | 0x2000000000000000;
  if (mtbdd == 0) {
    __ptr = "0 [shape=box, style=filled, label=\"F\"];\n";
    __size = 0x28;
  }
  else {
    if ((uVar2 >> 0x3e & 1) == 0) {
      fprintf((FILE *)out,"%lu [label=\"%u\"];\n",mtbdd,*(ulong *)(puVar1 + lVar3 + 8) >> 0x28);
      mtbdd_fprintdot_nc_rec(out,*(ulong *)(puVar1 + lVar3 + 8) & 0xffffffffff);
      mtbdd_fprintdot_nc_rec(out,*(ulong *)(puVar1 + lVar3) & 0x800000ffffffffff);
      fprintf((FILE *)out,"%lu -> %lu [style=dashed];\n",mtbdd,
              *(ulong *)(puVar1 + lVar3 + 8) & 0xffffffffff | mtbdd & 0x8000000000000000);
      fprintf((FILE *)out,"%lu -> %lu [style=solid];\n",mtbdd,
              *(ulong *)(puVar1 + lVar3) & 0x800000ffffffffff ^ mtbdd & 0x8000000000000000);
      return;
    }
    fprintf((FILE *)out,"%lu [shape=box, style=filled, label=\"",mtbdd,-mtbdd);
    mtbdd_fprint_leaf(out,mtbdd);
    __ptr = "\"];\n";
    __size = 4;
  }
  fwrite(__ptr,__size,1,(FILE *)out);
  return;
}

Assistant:

static void
mtbdd_fprintdot_nc_rec(FILE *out, MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd); // also works for mtbdd_false
    if (mtbddnode_getmark(n)) return;
    mtbddnode_setmark(n, 1);

    if (mtbdd == mtbdd_true) {
        fprintf(out, "%" PRIu64 " [shape=box, style=filled, label=\"T\"];\n", mtbdd);
    } else if (mtbdd == mtbdd_false) {
        fprintf(out, "0 [shape=box, style=filled, label=\"F\"];\n");
    } else if (mtbddnode_isleaf(n)) {
        fprintf(out, "%" PRIu64 " [shape=box, style=filled, label=\"", mtbdd);
        mtbdd_fprint_leaf(out, mtbdd);
        fprintf(out, "\"];\n");
    } else {
        fprintf(out, "%" PRIu64 " [label=\"%" PRIu32 "\"];\n", mtbdd, mtbddnode_getvariable(n));

        mtbdd_fprintdot_nc_rec(out, mtbddnode_getlow(n));
        mtbdd_fprintdot_nc_rec(out, mtbddnode_gethigh(n));

        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=dashed];\n", mtbdd, node_getlow(mtbdd, n));
        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=solid];\n", mtbdd, node_gethigh(mtbdd, n));
    }
}